

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_1x1_pack8.h
# Opt level: O3

void ncnn::conv1x1s1_sgemm_transform_kernel_pack8_avx
               (Mat *kernel,Mat *weight_data_pack8,int num_input,int num_output)

{
  size_t sVar1;
  size_t sVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  undefined4 *puVar6;
  int iVar7;
  long lVar8;
  undefined4 *puVar9;
  long lVar10;
  undefined4 *puVar11;
  long lVar12;
  undefined4 *puVar13;
  uint uVar14;
  Mat local_78;
  
  Mat::reshape(&local_78,kernel,1,num_input,num_output,(Allocator *)0x0);
  iVar7 = num_input + 7;
  if (-1 < num_input) {
    iVar7 = num_input;
  }
  iVar5 = num_output + 7;
  if (-1 < num_output) {
    iVar5 = num_output;
  }
  Mat::create(weight_data_pack8,1,iVar7 >> 3,iVar5 >> 3,0x100,0x40,(Allocator *)0x0);
  if (7 < num_output) {
    lVar10 = local_78.elemsize * local_78.cstep;
    sVar1 = weight_data_pack8->elemsize;
    iVar7 = weight_data_pack8->w;
    lVar8 = (local_78.cstep * -7 + (long)local_78.w) * local_78.elemsize;
    puVar11 = (undefined4 *)((long)weight_data_pack8->data + 0xfc);
    sVar2 = weight_data_pack8->cstep;
    uVar14 = 0;
    puVar6 = (undefined4 *)local_78.data;
    do {
      if (7 < num_input) {
        lVar12 = 7;
        puVar9 = puVar11;
        puVar13 = puVar6;
        do {
          puVar9[-0x3f] = *puVar13;
          puVar9[-0x3e] = *(undefined4 *)((long)puVar13 + lVar10);
          puVar9[-0x3d] = *(undefined4 *)((long)puVar13 + lVar10 * 2);
          puVar9[-0x3c] = *(undefined4 *)((long)puVar13 + lVar10 * 3);
          puVar9[-0x3b] = puVar13[lVar10];
          puVar9[-0x3a] = *(undefined4 *)((long)puVar13 + lVar10 * 5);
          puVar9[-0x39] = *(undefined4 *)((long)puVar13 + lVar10 * 6);
          puVar9[-0x38] = *(undefined4 *)((long)puVar13 + lVar10 * 7);
          lVar3 = lVar8 + lVar10 * 7;
          puVar9[-0x37] = *(undefined4 *)((long)puVar13 + lVar8 + lVar10 * 7);
          lVar4 = lVar10 + lVar3;
          puVar9[-0x36] = *(undefined4 *)((long)puVar13 + lVar10 + lVar3);
          lVar3 = lVar10 + lVar4;
          puVar9[-0x35] = *(undefined4 *)((long)puVar13 + lVar10 + lVar4);
          lVar4 = lVar10 + lVar3;
          puVar9[-0x34] = *(undefined4 *)((long)puVar13 + lVar10 + lVar3);
          lVar3 = lVar10 + lVar4;
          puVar9[-0x33] = *(undefined4 *)((long)puVar13 + lVar10 + lVar4);
          lVar4 = lVar10 + lVar3;
          puVar9[-0x32] = *(undefined4 *)((long)puVar13 + lVar10 + lVar3);
          lVar3 = lVar10 + lVar4;
          puVar9[-0x31] = *(undefined4 *)((long)puVar13 + lVar10 + lVar4);
          lVar4 = lVar10 + lVar3;
          puVar9[-0x30] = *(undefined4 *)((long)puVar13 + lVar10 + lVar3);
          lVar3 = lVar8 + lVar4;
          puVar9[-0x2f] = *(undefined4 *)((long)puVar13 + lVar8 + lVar4);
          lVar4 = lVar10 + lVar3;
          puVar9[-0x2e] = *(undefined4 *)((long)puVar13 + lVar10 + lVar3);
          lVar3 = lVar10 + lVar4;
          puVar9[-0x2d] = *(undefined4 *)((long)puVar13 + lVar10 + lVar4);
          lVar4 = lVar10 + lVar3;
          puVar9[-0x2c] = *(undefined4 *)((long)puVar13 + lVar10 + lVar3);
          lVar3 = lVar10 + lVar4;
          puVar9[-0x2b] = *(undefined4 *)((long)puVar13 + lVar10 + lVar4);
          lVar4 = lVar10 + lVar3;
          puVar9[-0x2a] = *(undefined4 *)((long)puVar13 + lVar10 + lVar3);
          lVar3 = lVar10 + lVar4;
          puVar9[-0x29] = *(undefined4 *)((long)puVar13 + lVar10 + lVar4);
          lVar4 = lVar10 + lVar3;
          puVar9[-0x28] = *(undefined4 *)((long)puVar13 + lVar10 + lVar3);
          lVar3 = lVar8 + lVar4;
          puVar9[-0x27] = *(undefined4 *)((long)puVar13 + lVar8 + lVar4);
          lVar4 = lVar10 + lVar3;
          puVar9[-0x26] = *(undefined4 *)((long)puVar13 + lVar10 + lVar3);
          lVar3 = lVar10 + lVar4;
          puVar9[-0x25] = *(undefined4 *)((long)puVar13 + lVar10 + lVar4);
          lVar4 = lVar10 + lVar3;
          puVar9[-0x24] = *(undefined4 *)((long)puVar13 + lVar10 + lVar3);
          lVar3 = lVar10 + lVar4;
          puVar9[-0x23] = *(undefined4 *)((long)puVar13 + lVar10 + lVar4);
          lVar4 = lVar10 + lVar3;
          puVar9[-0x22] = *(undefined4 *)((long)puVar13 + lVar10 + lVar3);
          lVar3 = lVar10 + lVar4;
          puVar9[-0x21] = *(undefined4 *)((long)puVar13 + lVar10 + lVar4);
          lVar4 = lVar10 + lVar3;
          puVar9[-0x20] = *(undefined4 *)((long)puVar13 + lVar10 + lVar3);
          lVar3 = lVar8 + lVar4;
          puVar9[-0x1f] = *(undefined4 *)((long)puVar13 + lVar8 + lVar4);
          lVar4 = lVar10 + lVar3;
          puVar9[-0x1e] = *(undefined4 *)((long)puVar13 + lVar10 + lVar3);
          lVar3 = lVar10 + lVar4;
          puVar9[-0x1d] = *(undefined4 *)((long)puVar13 + lVar10 + lVar4);
          lVar4 = lVar10 + lVar3;
          puVar9[-0x1c] = *(undefined4 *)((long)puVar13 + lVar10 + lVar3);
          lVar3 = lVar10 + lVar4;
          puVar9[-0x1b] = *(undefined4 *)((long)puVar13 + lVar10 + lVar4);
          lVar4 = lVar10 + lVar3;
          puVar9[-0x1a] = *(undefined4 *)((long)puVar13 + lVar10 + lVar3);
          lVar3 = lVar10 + lVar4;
          puVar9[-0x19] = *(undefined4 *)((long)puVar13 + lVar10 + lVar4);
          lVar4 = lVar10 + lVar3;
          puVar9[-0x18] = *(undefined4 *)((long)puVar13 + lVar10 + lVar3);
          lVar3 = lVar8 + lVar4;
          puVar9[-0x17] = *(undefined4 *)((long)puVar13 + lVar8 + lVar4);
          lVar4 = lVar10 + lVar3;
          puVar9[-0x16] = *(undefined4 *)((long)puVar13 + lVar10 + lVar3);
          lVar3 = lVar10 + lVar4;
          puVar9[-0x15] = *(undefined4 *)((long)puVar13 + lVar10 + lVar4);
          lVar4 = lVar10 + lVar3;
          puVar9[-0x14] = *(undefined4 *)((long)puVar13 + lVar10 + lVar3);
          lVar3 = lVar10 + lVar4;
          puVar9[-0x13] = *(undefined4 *)((long)puVar13 + lVar10 + lVar4);
          lVar4 = lVar10 + lVar3;
          puVar9[-0x12] = *(undefined4 *)((long)puVar13 + lVar10 + lVar3);
          lVar3 = lVar10 + lVar4;
          puVar9[-0x11] = *(undefined4 *)((long)puVar13 + lVar10 + lVar4);
          lVar4 = lVar10 + lVar3;
          puVar9[-0x10] = *(undefined4 *)((long)puVar13 + lVar10 + lVar3);
          lVar3 = lVar8 + lVar4;
          puVar9[-0xf] = *(undefined4 *)((long)puVar13 + lVar8 + lVar4);
          lVar4 = lVar10 + lVar3;
          puVar9[-0xe] = *(undefined4 *)((long)puVar13 + lVar10 + lVar3);
          lVar3 = lVar10 + lVar4;
          puVar9[-0xd] = *(undefined4 *)((long)puVar13 + lVar10 + lVar4);
          lVar4 = lVar10 + lVar3;
          puVar9[-0xc] = *(undefined4 *)((long)puVar13 + lVar10 + lVar3);
          lVar3 = lVar10 + lVar4;
          puVar9[-0xb] = *(undefined4 *)((long)puVar13 + lVar10 + lVar4);
          lVar4 = lVar10 + lVar3;
          puVar9[-10] = *(undefined4 *)((long)puVar13 + lVar10 + lVar3);
          lVar3 = lVar10 + lVar4;
          puVar9[-9] = *(undefined4 *)((long)puVar13 + lVar10 + lVar4);
          lVar4 = lVar10 + lVar3;
          puVar9[-8] = *(undefined4 *)((long)puVar13 + lVar10 + lVar3);
          lVar3 = lVar8 + lVar4;
          puVar9[-7] = *(undefined4 *)((long)puVar13 + lVar8 + lVar4);
          lVar4 = lVar10 + lVar3;
          puVar9[-6] = *(undefined4 *)((long)puVar13 + lVar10 + lVar3);
          lVar3 = lVar10 + lVar4;
          puVar9[-5] = *(undefined4 *)((long)puVar13 + lVar10 + lVar4);
          lVar4 = lVar10 + lVar3;
          puVar9[-4] = *(undefined4 *)((long)puVar13 + lVar10 + lVar3);
          lVar3 = lVar10 + lVar4;
          puVar9[-3] = *(undefined4 *)((long)puVar13 + lVar10 + lVar4);
          lVar4 = lVar10 + lVar3;
          puVar9[-2] = *(undefined4 *)((long)puVar13 + lVar10 + lVar3);
          puVar9[-1] = *(undefined4 *)((long)puVar13 + lVar10 + lVar4);
          *puVar9 = *(undefined4 *)((long)puVar13 + lVar10 * 2 + lVar4);
          puVar9 = (undefined4 *)((long)puVar9 + (long)iVar7 * sVar1);
          puVar13 = puVar13 + local_78.elemsize * (long)local_78.w * 2;
          lVar12 = lVar12 + 8;
        } while (lVar12 < num_input);
      }
      uVar14 = uVar14 + 8;
      puVar11 = (undefined4 *)((long)puVar11 + sVar1 * sVar2);
      puVar6 = puVar6 + lVar10 * 2;
    } while ((int)(uVar14 | 7) < num_output);
  }
  if (local_78.refcount != (int *)0x0) {
    LOCK();
    *local_78.refcount = *local_78.refcount + -1;
    UNLOCK();
    if (*local_78.refcount == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        if ((undefined4 *)local_78.data != (undefined4 *)0x0) {
          free(local_78.data);
        }
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void conv1x1s1_sgemm_transform_kernel_pack8_avx(const Mat& kernel, Mat& weight_data_pack8, int num_input, int num_output)
{
    // src = kw-kh-inch-outch
    // dst = 8b-8a-kw-kh-inch/8a-outch/8b
    Mat weight_data_r2 = kernel.reshape(1, num_input, num_output);

    weight_data_pack8.create(1, num_input / 8, num_output / 8, (size_t)4 * 64, 64);

    for (int q = 0; q + 7 < num_output; q += 8)
    {
        const Mat k0 = weight_data_r2.channel(q);
        const Mat k1 = weight_data_r2.channel(q + 1);
        const Mat k2 = weight_data_r2.channel(q + 2);
        const Mat k3 = weight_data_r2.channel(q + 3);
        const Mat k4 = weight_data_r2.channel(q + 4);
        const Mat k5 = weight_data_r2.channel(q + 5);
        const Mat k6 = weight_data_r2.channel(q + 6);
        const Mat k7 = weight_data_r2.channel(q + 7);

        Mat g0 = weight_data_pack8.channel(q / 8);

        for (int p = 0; p + 7 < num_input; p += 8)
        {
            const float* k00 = k0.row(p);
            const float* k01 = k0.row(p + 1);
            const float* k02 = k0.row(p + 2);
            const float* k03 = k0.row(p + 3);
            const float* k04 = k0.row(p + 4);
            const float* k05 = k0.row(p + 5);
            const float* k06 = k0.row(p + 6);
            const float* k07 = k0.row(p + 7);

            const float* k10 = k1.row(p);
            const float* k11 = k1.row(p + 1);
            const float* k12 = k1.row(p + 2);
            const float* k13 = k1.row(p + 3);
            const float* k14 = k1.row(p + 4);
            const float* k15 = k1.row(p + 5);
            const float* k16 = k1.row(p + 6);
            const float* k17 = k1.row(p + 7);

            const float* k20 = k2.row(p);
            const float* k21 = k2.row(p + 1);
            const float* k22 = k2.row(p + 2);
            const float* k23 = k2.row(p + 3);
            const float* k24 = k2.row(p + 4);
            const float* k25 = k2.row(p + 5);
            const float* k26 = k2.row(p + 6);
            const float* k27 = k2.row(p + 7);

            const float* k30 = k3.row(p);
            const float* k31 = k3.row(p + 1);
            const float* k32 = k3.row(p + 2);
            const float* k33 = k3.row(p + 3);
            const float* k34 = k3.row(p + 4);
            const float* k35 = k3.row(p + 5);
            const float* k36 = k3.row(p + 6);
            const float* k37 = k3.row(p + 7);

            const float* k40 = k4.row(p);
            const float* k41 = k4.row(p + 1);
            const float* k42 = k4.row(p + 2);
            const float* k43 = k4.row(p + 3);
            const float* k44 = k4.row(p + 4);
            const float* k45 = k4.row(p + 5);
            const float* k46 = k4.row(p + 6);
            const float* k47 = k4.row(p + 7);

            const float* k50 = k5.row(p);
            const float* k51 = k5.row(p + 1);
            const float* k52 = k5.row(p + 2);
            const float* k53 = k5.row(p + 3);
            const float* k54 = k5.row(p + 4);
            const float* k55 = k5.row(p + 5);
            const float* k56 = k5.row(p + 6);
            const float* k57 = k5.row(p + 7);

            const float* k60 = k6.row(p);
            const float* k61 = k6.row(p + 1);
            const float* k62 = k6.row(p + 2);
            const float* k63 = k6.row(p + 3);
            const float* k64 = k6.row(p + 4);
            const float* k65 = k6.row(p + 5);
            const float* k66 = k6.row(p + 6);
            const float* k67 = k6.row(p + 7);

            const float* k70 = k7.row(p);
            const float* k71 = k7.row(p + 1);
            const float* k72 = k7.row(p + 2);
            const float* k73 = k7.row(p + 3);
            const float* k74 = k7.row(p + 4);
            const float* k75 = k7.row(p + 5);
            const float* k76 = k7.row(p + 6);
            const float* k77 = k7.row(p + 7);

            float* g00 = g0.row(p / 8);
            g00[0] = k00[0];
            g00[1] = k10[0];
            g00[2] = k20[0];
            g00[3] = k30[0];
            g00[4] = k40[0];
            g00[5] = k50[0];
            g00[6] = k60[0];
            g00[7] = k70[0];
            g00 += 8;
            g00[0] = k01[0];
            g00[1] = k11[0];
            g00[2] = k21[0];
            g00[3] = k31[0];
            g00[4] = k41[0];
            g00[5] = k51[0];
            g00[6] = k61[0];
            g00[7] = k71[0];

            g00 += 8;
            g00[0] = k02[0];
            g00[1] = k12[0];
            g00[2] = k22[0];
            g00[3] = k32[0];
            g00[4] = k42[0];
            g00[5] = k52[0];
            g00[6] = k62[0];
            g00[7] = k72[0];

            g00 += 8;
            g00[0] = k03[0];
            g00[1] = k13[0];
            g00[2] = k23[0];
            g00[3] = k33[0];
            g00[4] = k43[0];
            g00[5] = k53[0];
            g00[6] = k63[0];
            g00[7] = k73[0];

            g00 += 8;
            g00[0] = k04[0];
            g00[1] = k14[0];
            g00[2] = k24[0];
            g00[3] = k34[0];
            g00[4] = k44[0];
            g00[5] = k54[0];
            g00[6] = k64[0];
            g00[7] = k74[0];

            g00 += 8;
            g00[0] = k05[0];
            g00[1] = k15[0];
            g00[2] = k25[0];
            g00[3] = k35[0];
            g00[4] = k45[0];
            g00[5] = k55[0];
            g00[6] = k65[0];
            g00[7] = k75[0];

            g00 += 8;
            g00[0] = k06[0];
            g00[1] = k16[0];
            g00[2] = k26[0];
            g00[3] = k36[0];
            g00[4] = k46[0];
            g00[5] = k56[0];
            g00[6] = k66[0];
            g00[7] = k76[0];

            g00 += 8;
            g00[0] = k07[0];
            g00[1] = k17[0];
            g00[2] = k27[0];
            g00[3] = k37[0];
            g00[4] = k47[0];
            g00[5] = k57[0];
            g00[6] = k67[0];
            g00[7] = k77[0];

            g00 += 8;
        }
    }
}